

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  XMLSize_t t;
  MemoryManager *manager;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *objToStore_00;
  ElemVector *data;
  XMLCh *pXStack_70;
  int key2;
  void *key1;
  undefined1 local_58 [8];
  RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  e;
  XMLSize_t itemNumber;
  XSerializeEngine *serEng_local;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
        ::getHashModulus(objToStore);
    XSerializeEngine::writeSize(serEng,t);
    e.fLockPrimaryKey = (void *)0x0;
    manager = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
              ::getMemoryManager(objToStore);
    RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::RefHash2KeysTableOfEnumerator
              ((RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                *)local_58,objToStore,false,manager);
    while (bVar1 = RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                   ::hasMoreElements((RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                                      *)local_58), bVar1) {
      RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::nextElement((RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                     *)local_58);
      e.fLockPrimaryKey = (void *)((long)e.fLockPrimaryKey + 1);
    }
    XSerializeEngine::writeSize(serEng,(XMLSize_t)e.fLockPrimaryKey);
    RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::Reset((RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             *)local_58);
    while (bVar1 = RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                   ::hasMoreElements((RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                                      *)local_58), bVar1) {
      RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::nextElementKey((RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                        *)local_58,&stack0xffffffffffffff90,(int *)((long)&data + 4));
      XSerializeEngine::writeString(serEng,pXStack_70,0,false);
      XSerializeEngine::operator<<(serEng,data._4_4_);
      objToStore_00 =
           RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
           ::get(objToStore,pXStack_70,data._4_4_);
      storeObject(objToStore_00,serEng);
    }
    RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::~RefHash2KeysTableOfEnumerator
              ((RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                *)local_58);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHash2KeysTableOf<ElemVector>* const objToStore
                                    , XSerializeEngine&                      serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        XMLSize_t itemNumber = 0;

        RefHash2KeysTableOfEnumerator<ElemVector> e(objToStore, false, objToStore->getMemoryManager());

        while (e.hasMoreElements())
        {
            e.nextElement();
            itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

#ifdef XERCES_DEBUG_SORT_GRAMMAR

        //to sort the key
        SORT_KEYSET_TWOKEYS(serEng.getMemoryManager())

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            serEng.writeString(strKey);
            serEng<<intKey1;

            ElemVector* data = objToStore->get(strKey, intKey1);
            storeObject(data, serEng);
        }
#else

        while (e.hasMoreElements())
        {
            void*      key1;
            int        key2;

            e.nextElementKey(key1, key2);
            serEng.writeString((const XMLCh*)key1);
            serEng<<key2;

            ElemVector* data = objToStore->get(key1, key2);
            storeObject(data, serEng);

        }
#endif
    }

}